

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O3

uint32_t __thiscall duckdb::EncryptionTransport::Finalize(EncryptionTransport *this)

{
  uint uVar1;
  long lVar2;
  EncryptionState *pEVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t total_length;
  data_t tag [16];
  data_t aes_buffer [4096];
  int local_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [4104];
  
  local_104c = duckdb::ArenaAllocator::SizeInBytes();
  local_104c = local_104c + 0x1c;
  (*this->trans->_vptr_TTransport[9])(this->trans,&local_104c,4);
  (*this->trans->_vptr_TTransport[9])(this->trans,this->nonce,0xc);
  lVar2 = duckdb::ArenaAllocator::GetTail();
  if (lVar2 != 0) {
    do {
      uVar5 = *(ulong *)(lVar2 + 0x18);
      if (uVar5 != 0) {
        lVar4 = 0;
        uVar6 = 0;
        do {
          uVar5 = uVar5 + lVar4;
          if (0xfff < uVar5) {
            uVar5 = 0x1000;
          }
          pEVar3 = shared_ptr<duckdb::EncryptionState,_true>::operator->(&this->aes);
          uVar1 = (**(code **)(*(long *)pEVar3 + 0x20))
                            (pEVar3,*(long *)(lVar2 + 8) + uVar6,uVar5,local_1038,0x1000);
          (*this->trans->_vptr_TTransport[9])(this->trans,local_1038,(ulong)uVar1);
          uVar6 = uVar6 + 0x1000;
          uVar5 = *(ulong *)(lVar2 + 0x18);
          lVar4 = lVar4 + -0x1000;
        } while (uVar6 < uVar5);
      }
      lVar2 = *(long *)(lVar2 + 0x30);
    } while (lVar2 != 0);
  }
  pEVar3 = shared_ptr<duckdb::EncryptionState,_true>::operator->(&this->aes);
  uVar1 = (**(code **)(*(long *)pEVar3 + 0x28))(pEVar3,local_1038,0,local_1048,0x10);
  (*this->trans->_vptr_TTransport[9])(this->trans,local_1038,(ulong)uVar1);
  (*this->trans->_vptr_TTransport[9])(this->trans,local_1048,0x10);
  return local_104c + 4;
}

Assistant:

uint32_t Finalize() {
		// Write length
		const auto ciphertext_length = allocator.SizeInBytes();
		const uint32_t total_length = ParquetCrypto::NONCE_BYTES + ciphertext_length + ParquetCrypto::TAG_BYTES;

		trans.write(const_data_ptr_cast(&total_length), ParquetCrypto::LENGTH_BYTES);
		// Write nonce at beginning of encrypted chunk
		trans.write(nonce, ParquetCrypto::NONCE_BYTES);

		data_t aes_buffer[ParquetCrypto::CRYPTO_BLOCK_SIZE];
		auto current = allocator.GetTail();

		// Loop through the whole chunk
		while (current != nullptr) {
			for (idx_t pos = 0; pos < current->current_position; pos += ParquetCrypto::CRYPTO_BLOCK_SIZE) {
				auto next = MinValue<idx_t>(current->current_position - pos, ParquetCrypto::CRYPTO_BLOCK_SIZE);
				auto write_size =
				    aes->Process(current->data.get() + pos, next, aes_buffer, ParquetCrypto::CRYPTO_BLOCK_SIZE);
				trans.write(aes_buffer, write_size);
			}
			current = current->prev;
		}

		// Finalize the last encrypted data
		data_t tag[ParquetCrypto::TAG_BYTES];
		auto write_size = aes->Finalize(aes_buffer, 0, tag, ParquetCrypto::TAG_BYTES);
		trans.write(aes_buffer, write_size);
		// Write tag for verification
		trans.write(tag, ParquetCrypto::TAG_BYTES);

		return ParquetCrypto::LENGTH_BYTES + total_length;
	}